

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

void __thiscall llama_model_loader::print_info(llama_model_loader *this)

{
  char *pcVar1;
  undefined8 uVar2;
  long in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  llama_ftype in_stack_0000011c;
  string local_28 [40];
  
  pcVar1 = llama_file_version_name(*(llama_fver *)(in_RDI + 0x44));
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: file format = %s\n","print_info",pcVar1);
  llama_model_ftype_name_abi_cxx11_(in_stack_0000011c);
  uVar2 = std::__cxx11::string::c_str();
  llama_log_internal(GGML_LOG_LEVEL_INFO,"%s: file type   = %s\n","print_info",uVar2);
  std::__cxx11::string::~string(local_28);
  if (*(ulong *)(in_RDI + 0x18) < 0x40000000) {
    uVar2 = *(undefined8 *)(in_RDI + 0x18);
    auVar4._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar4._0_8_ = uVar2;
    auVar4._12_4_ = 0x45300000;
    dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    uVar2 = *(undefined8 *)(in_RDI + 0x10);
    auVar6._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    llama_log_internal((ggml_log_level)(dVar3 * 0.0009765625 * 0.0009765625),
                       (char *)((dVar3 * 8.0) /
                               ((auVar6._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))),2,
                       "%s: file size   = %.2f MiB (%.2f BPW) \n","print_info");
  }
  else {
    uVar2 = *(undefined8 *)(in_RDI + 0x18);
    auVar5._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar5._0_8_ = uVar2;
    auVar5._12_4_ = 0x45300000;
    dVar3 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    uVar2 = *(undefined8 *)(in_RDI + 0x10);
    auVar7._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar7._0_8_ = uVar2;
    auVar7._12_4_ = 0x45300000;
    llama_log_internal((ggml_log_level)(dVar3 * 0.0009765625 * 0.0009765625 * 0.0009765625),
                       (char *)((dVar3 * 8.0) /
                               ((auVar7._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))),2,
                       "%s: file size   = %.2f GiB (%.2f BPW) \n","print_info");
  }
  return;
}

Assistant:

void llama_model_loader::print_info() const {
    LLAMA_LOG_INFO("%s: file format = %s\n", __func__, llama_file_version_name(fver));
    LLAMA_LOG_INFO("%s: file type   = %s\n", __func__, llama_model_ftype_name(ftype).c_str());
    if (n_bytes < GiB) {
        LLAMA_LOG_INFO("%s: file size   = %.2f MiB (%.2f BPW) \n", __func__, n_bytes/1024.0/1024.0,        n_bytes*8.0/n_elements);
    } else {
        LLAMA_LOG_INFO("%s: file size   = %.2f GiB (%.2f BPW) \n", __func__, n_bytes/1024.0/1024.0/1024.0, n_bytes*8.0/n_elements);
    }
}